

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O1

int open_socket(char *host,unsigned_short port)

{
  int __fd;
  int iVar1;
  hostent *phVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  sockaddr_in far_end;
  stringstream msg;
  char local_1d8;
  undefined7 uStack_1d7;
  long local_1d0;
  undefined1 local_1c8 [16];
  sockaddr local_1b8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  phVar2 = gethostbyname(host);
  if (phVar2 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"gethostbyname(",0xe);
    poVar3 = std::operator<<(local_198,host);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)CONCAT71(uStack_1d7,local_1d8),local_1d0);
    std::endl<char,std::char_traits<char>>(poVar3);
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(char *)CONCAT71(uStack_1d7,local_1d8));
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __fd = socket(2,1,0);
  if (__fd != -1) {
    local_1b8.sa_family = 2;
    local_1b8.sa_data._0_2_ = port << 8 | port >> 8;
    local_1b8.sa_data._2_4_ = *(undefined4 *)*phVar2->h_addr_list;
    local_1b8.sa_data[6] = '\0';
    local_1b8.sa_data[7] = '\0';
    local_1b8.sa_data[8] = '\0';
    local_1b8.sa_data[9] = '\0';
    local_1b8.sa_data[10] = '\0';
    local_1b8.sa_data[0xb] = '\0';
    local_1b8.sa_data[0xc] = '\0';
    local_1b8.sa_data[0xd] = '\0';
    iVar1 = connect(__fd,&local_1b8,0x10);
    if (iVar1 != -1) {
      return __fd;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"connect(",8);
    poVar3 = std::operator<<(local_198,host);
    local_1d8 = ':';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1d8,1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    std::__cxx11::stringbuf::str();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)CONCAT71(uStack_1d7,local_1d8),local_1d0);
    std::endl<char,std::char_traits<char>>(poVar3);
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(char *)CONCAT71(uStack_1d7,local_1d8));
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"socket: ",8);
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(local_198,pcVar5);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)CONCAT71(uStack_1d7,local_1d8),local_1d0);
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(char *)CONCAT71(uStack_1d7,local_1d8));
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int open_socket(const char* host, unsigned short port)
{
  hostent* he;
  he = gethostbyname(host);

  if (he == nullptr)
  {
    stringstream msg;
    msg << "gethostbyname(" << host << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  int sd = socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
  {
    stringstream msg;
    msg << "socket: " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
  {
    stringstream msg;
    msg << "connect(" << host << ':' << port << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  return sd;
}